

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

bsc_step_t
bsc_allreduce_qtree_single
          (bsc_step_t depends,bsc_group_t group,void *src,void *dst,void *tmp_space,
          bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size,bsc_pid_t q)

{
  long lVar1;
  int iVar2;
  int iVar3;
  bsp_pid_t bVar4;
  int iVar5;
  bsp_pid_t bVar6;
  void *pvVar7;
  request_t *prVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bsc_step_t local_74;
  
  if (group == (bsc_group_t)0x0) {
    iVar3 = bsp_nprocs();
    iVar5 = bsp_pid();
  }
  else {
    iVar3 = *group;
    lVar1 = *(long *)((long)group + 8);
    bVar4 = bsp_pid();
    iVar5 = *(int *)(lVar1 + (long)bVar4 * 4);
  }
  pvVar7 = tmp_space;
  if (iVar3 == 1) {
    pvVar7 = dst;
  }
  (*reducer)(pvVar7,zero,src,nmemb * size);
  local_74 = depends;
  if (1 < iVar3) {
    pvVar7 = (void *)((long)size + (long)tmp_space);
    iVar12 = 1;
    do {
      iVar11 = 1;
      iVar10 = q + -1;
      iVar2 = iVar12;
      if (1 < q) {
        do {
          if (iVar2 < iVar3) {
            bVar4 = (iVar5 + iVar2) % iVar3;
            if (group != (bsc_group_t)0x0) {
              bVar4 = *(bsp_pid_t *)(*(long *)((long)group + 0x10) + (long)bVar4 * 4);
            }
            bVar6 = bsp_pid();
            prVar8 = new_request(local_74);
            prVar8->kind = GET;
            (prVar8->payload).put.src_addr = tmp_space;
            (prVar8->payload).put.dst_addr = (void *)((long)(iVar11 * size) + (long)pvVar7);
            (prVar8->payload).put.src_pid = bVar4;
            (prVar8->payload).put.dst_pid = bVar6;
            (prVar8->payload).put.size = size;
            (prVar8->payload).put.offset = 0;
            iVar11 = iVar11 + 1;
          }
          iVar10 = iVar10 + -1;
          iVar2 = iVar2 + iVar12;
        } while (iVar10 != 0);
      }
      bVar4 = bsp_pid();
      bVar6 = bsp_pid();
      prVar8 = new_request(local_74);
      prVar8->kind = GET;
      (prVar8->payload).put.src_addr = tmp_space;
      (prVar8->payload).put.dst_addr = pvVar7;
      (prVar8->payload).put.src_pid = bVar4;
      (prVar8->payload).put.dst_pid = bVar6;
      (prVar8->payload).put.size = size;
      (prVar8->payload).put.offset = 0;
      iVar12 = iVar12 * q;
      prVar8 = new_request(local_74);
      local_74 = local_74 + 1;
      pvVar9 = dst;
      if (iVar12 < iVar3) {
        pvVar9 = tmp_space;
      }
      prVar8->kind = EXEC;
      (prVar8->payload).exec.func = reducer;
      (prVar8->payload).put.dst_addr = pvVar9;
      (prVar8->payload).exec.a0 = zero;
      (prVar8->payload).exec.xs = pvVar7;
      (prVar8->payload).exec.size = iVar11 * size;
    } while (iVar12 < iVar3);
  }
  return local_74;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_allreduce_qtree_single( 
        bsc_step_t depends, bsc_group_t group,
        const void * src, void * dst, void * tmp_space,
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size, 
        bsc_pid_t q )
{
    const group_t * g = group;
    bsc_pid_t i, j, k, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, s = g?g->lid[bsp_pid()]:bsp_pid();
    char * tmp_bytes = tmp_space;
    void * accum = tmp_bytes;
    char * gather = tmp_bytes + size;

    (*reducer)( P==1?dst:accum, zero, src, size * nmemb );

    for (range = 1; range < P; range *= q ) {
        k = 1;
        for ( i = 1 ; i < q; ++i) {
            if (i * range < P) {
                j = (i * range + s)%P; 
                bsc_get( depends, g?g->gid[j]:j, accum, 0,
                        &gather[k * size], size);
                k+=1;
            }
        }
        bsc_get( depends, bsp_pid(), accum, 0, gather, size );
        bsc_exec_reduce( depends, reducer, range*q>=P?dst:accum, zero, gather, size*k );
        depends += 1;
    }
    return depends;
}